

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_split_list(t_list_split *x,t_symbol *s,int argc,t_atom *argv)

{
  long lVar1;
  uint argc_00;
  
  argc_00 = 0;
  if (0 < (int)x->x_f) {
    argc_00 = (int)x->x_f;
  }
  if (argc < (int)argc_00) {
    lVar1 = 0x48;
    argc_00 = argc;
  }
  else {
    outlet_list(x->x_out2,&s_list,argc - argc_00,argv + argc_00);
    lVar1 = 0x38;
  }
  outlet_list(*(_outlet **)((long)&(x->x_obj).te_g.g_pd + lVar1),&s_list,argc_00,argv);
  return;
}

Assistant:

static void list_split_list(t_list_split *x, t_symbol *s,
    int argc, t_atom *argv)
{
    int n = x->x_f;
    if (n < 0)
        n = 0;
    if (argc >= n)
    {
        outlet_list(x->x_out2, &s_list, argc-n, argv+n);
        outlet_list(x->x_out1, &s_list, n, argv);
    }
    else outlet_list(x->x_out3, &s_list, argc, argv);
}